

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3DeclareVtab(int *pRc,Fts3Table *p)

{
  bool bVar1;
  char *pcVar2;
  long in_RSI;
  int *in_RDI;
  char *unaff_retaddr;
  sqlite3 *in_stack_00000008;
  char *zLanguageid;
  char *zCols;
  char *zSql;
  int rc;
  int i;
  char *local_38;
  char *local_28;
  int local_18;
  int local_14;
  
  if (*in_RDI == 0) {
    if (*(long *)(in_RSI + 0x58) == 0) {
      local_38 = "__langid";
    }
    else {
      local_38 = *(char **)(in_RSI + 0x58);
    }
    sqlite3_vtab_config(*(sqlite3 **)(in_RSI + 0x18),1);
    sqlite3_vtab_config(*(sqlite3 **)(in_RSI + 0x18),2);
    local_28 = sqlite3_mprintf("%Q, ",**(undefined8 **)(in_RSI + 0x38));
    local_14 = 1;
    while( true ) {
      bVar1 = false;
      if (local_28 != (char *)0x0) {
        bVar1 = local_14 < *(int *)(in_RSI + 0x30);
      }
      if (!bVar1) break;
      local_28 = sqlite3_mprintf("%z%Q, ",local_28,
                                 *(undefined8 *)(*(long *)(in_RSI + 0x38) + (long)local_14 * 8));
      local_14 = local_14 + 1;
    }
    pcVar2 = sqlite3_mprintf("CREATE TABLE x(%s %Q HIDDEN, docid HIDDEN, %Q HIDDEN)",local_28,
                             *(undefined8 *)(in_RSI + 0x28),local_38);
    if ((local_28 == (char *)0x0) || (pcVar2 == (char *)0x0)) {
      local_18 = 7;
    }
    else {
      local_18 = sqlite3_declare_vtab(in_stack_00000008,unaff_retaddr);
    }
    sqlite3_free((void *)0x24a5c3);
    sqlite3_free((void *)0x24a5cd);
    *in_RDI = local_18;
  }
  return;
}

Assistant:

static void fts3DeclareVtab(int *pRc, Fts3Table *p){
  if( *pRc==SQLITE_OK ){
    int i;                        /* Iterator variable */
    int rc;                       /* Return code */
    char *zSql;                   /* SQL statement passed to declare_vtab() */
    char *zCols;                  /* List of user defined columns */
    const char *zLanguageid;

    zLanguageid = (p->zLanguageid ? p->zLanguageid : "__langid");
    sqlite3_vtab_config(p->db, SQLITE_VTAB_CONSTRAINT_SUPPORT, 1);
    sqlite3_vtab_config(p->db, SQLITE_VTAB_INNOCUOUS);

    /* Create a list of user columns for the virtual table */
    zCols = sqlite3_mprintf("%Q, ", p->azColumn[0]);
    for(i=1; zCols && i<p->nColumn; i++){
      zCols = sqlite3_mprintf("%z%Q, ", zCols, p->azColumn[i]);
    }

    /* Create the whole "CREATE TABLE" statement to pass to SQLite */
    zSql = sqlite3_mprintf(
        "CREATE TABLE x(%s %Q HIDDEN, docid HIDDEN, %Q HIDDEN)",
        zCols, p->zName, zLanguageid
    );
    if( !zCols || !zSql ){
      rc = SQLITE_NOMEM;
    }else{
      rc = sqlite3_declare_vtab(p->db, zSql);
    }

    sqlite3_free(zSql);
    sqlite3_free(zCols);
    *pRc = rc;
  }
}